

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

scalar_function_t *
duckdb::GetScalarBinaryFunction<duckdb::SubtractOperator>
          (scalar_function_t *__return_storage_ptr__,PhysicalType type)

{
  _Requires<_Callable<void_(*)(DataChunk_&,_ExpressionState_&,_Vector_&)>,_function<void_(DataChunk_&,_ExpressionState_&,_Vector_&)>_&>
  pfVar1;
  scalar_function_t *psVar2;
  int iVar3;
  undefined7 in_register_00000031;
  _Any_data local_30;
  code *local_20;
  
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  iVar3 = (int)CONCAT71(in_register_00000031,type);
  if (iVar3 == 0xc) {
    local_30._M_unused._M_object =
         ScalarFunction::BinaryFunction<double,double,double,duckdb::SubtractOperator>;
  }
  else {
    if (iVar3 != 0xb) {
      GetScalarIntegerFunction<duckdb::SubtractOperator>((scalar_function_t *)&local_30,type);
      ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      operator=(__return_storage_ptr__,
                (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )&local_30);
      if (local_20 == (code *)0x0) {
        return (scalar_function_t *)0x0;
      }
      psVar2 = (scalar_function_t *)(*local_20)(&local_30,&local_30,3);
      return psVar2;
    }
    local_30._M_unused._M_object =
         ScalarFunction::BinaryFunction<float,float,float,duckdb::SubtractOperator>;
  }
  pfVar1 = ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
           operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                     __return_storage_ptr__,
                     (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)&local_30);
  return pfVar1;
}

Assistant:

static scalar_function_t GetScalarBinaryFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::FLOAT:
		function = &ScalarFunction::BinaryFunction<float, float, float, OP>;
		break;
	case PhysicalType::DOUBLE:
		function = &ScalarFunction::BinaryFunction<double, double, double, OP>;
		break;
	default:
		function = GetScalarIntegerFunction<OP>(type);
		break;
	}
	return function;
}